

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O2

void __thiscall RX::~RX(RX *this)

{
  if (this->_compiled == true) {
    regfree((regex_t *)&this->_regex);
  }
  std::__cxx11::string::~string((string *)&this->_pattern);
  return;
}

Assistant:

RX::~RX ()
{
  if (_compiled)
    regfree (&_regex);
}